

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLParser.cpp
# Opt level: O1

void __thiscall xe::xml::Tokenizer::advance(Tokenizer *this)

{
  Token TVar1;
  int iVar2;
  uchar *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 extraout_RAX;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  State SVar9;
  State SVar10;
  int iVar11;
  Tokenizer *pTVar12;
  int iVar13;
  uint uVar14;
  bool bVar15;
  bool bVar16;
  string local_50;
  
  TVar1 = this->m_curToken;
  if (TVar1 < TOKEN_LAST) {
    if ((0x2a88U >> (TVar1 & 0x1f) & 1) == 0) {
      if (TVar1 == TOKEN_INCOMPLETE) goto LAB_00119b1c;
    }
    else {
      this->m_state = STATE_DATA;
    }
  }
  iVar11 = this->m_curTokenLen;
  (this->m_buf).m_back = ((this->m_buf).m_back + iVar11) % (this->m_buf).m_size;
  iVar11 = (this->m_buf).m_numElements - iVar11;
  (this->m_buf).m_numElements = iVar11;
  this->m_curToken = TOKEN_INCOMPLETE;
  this->m_curTokenLen = 0;
  if ((0 < iVar11) && ((this->m_buf).m_buffer[(this->m_buf).m_back % (this->m_buf).m_size] == '\0'))
  {
    uVar5 = 0x100000001;
LAB_00119b10:
    this->m_curToken = (int)uVar5;
    this->m_curTokenLen = (int)((ulong)uVar5 >> 0x20);
    return;
  }
LAB_00119b1c:
  uVar14 = 0xffffffff;
  if (this->m_curTokenLen < (this->m_buf).m_numElements) {
    uVar14 = (uint)(this->m_buf).m_buffer
                   [(this->m_curTokenLen + (this->m_buf).m_back) % (this->m_buf).m_size];
  }
  iVar11 = this->m_curTokenLen;
  SVar9 = this->m_state;
  iVar13 = (this->m_buf).m_numElements;
  iVar2 = (this->m_buf).m_size;
  puVar3 = (this->m_buf).m_buffer;
  uVar6 = (ulong)(uint)(this->m_buf).m_back;
  while( true ) {
    SVar10 = SVar9;
    while (SVar10 == STATE_DATA) {
      if (1 < uVar14 + 1) {
        SVar10 = STATE_TAG;
        if (uVar14 != 0x3c) {
          if (uVar14 != 0x26) goto LAB_00119db6;
          SVar10 = STATE_ENTITY;
        }
        this->m_state = SVar10;
      }
      if (0 < iVar11) {
        this->m_curToken = TOKEN_DATA;
        return;
      }
      if (uVar14 + 1 < 2) {
        return;
      }
    }
    if (iVar11 == 0) {
      while ((uVar14 < 0x21 && ((0x100002600U >> ((ulong)uVar14 & 0x3f) & 1) != 0))) {
        uVar4 = (long)((int)uVar6 + 1) % (long)iVar2;
        uVar6 = uVar4 & 0xffffffff;
        iVar7 = (int)uVar4;
        (this->m_buf).m_back = iVar7;
        iVar13 = iVar13 + -1;
        (this->m_buf).m_numElements = iVar13;
        uVar14 = 0xffffffff;
        if (0 < iVar13) {
          uVar14 = (uint)puVar3[iVar7];
        }
      }
    }
    if (uVar14 == 0xffffffff) {
      return;
    }
    if (uVar14 == 0) break;
    SVar9 = SVar10;
    if (iVar11 == 0) {
      SVar10 = STATE_VALUE;
      if (((uVar14 != 0x22) && (uVar14 != 0x27)) &&
         (SVar10 = STATE_IDENTIFIER, 0x19 < (uVar14 & 0xffffffdf) - 0x41)) {
        SVar10 = STATE_TAG;
        switch(uVar14) {
        case 0x3c:
        case 0x3f:
          break;
        case 0x3d:
          uVar5 = 0x10000000c;
          goto LAB_00119b10;
        case 0x3e:
          uVar5 = 0x100000007;
          goto LAB_00119b10;
        default:
          if (uVar14 == 0x26) goto LAB_00119db6;
          if (uVar14 != 0x2f) goto LAB_00119f99;
        }
      }
switchD_00119c9b_caseD_3c:
      this->m_state = SVar10;
      SVar9 = SVar10;
    }
    else {
      iVar7 = (int)uVar6;
      switch(SVar10) {
      case STATE_IDENTIFIER:
        if ((((9 < uVar14 - 0x30) && (0x19 < (uVar14 & 0xffffffdf) - 0x41)) && (uVar14 != 0x2d)) &&
           (uVar14 != 0x5f)) {
          this->m_curToken = TOKEN_IDENTIFIER;
          return;
        }
        break;
      case STATE_VALUE:
        if ((uVar14 == 0x27) || (uVar14 == 0x22)) {
          if ((this->m_buf).m_numElements < 1) {
            uVar8 = 0xffffffff;
          }
          else {
            uVar8 = (uint)(this->m_buf).m_buffer[(this->m_buf).m_back % (this->m_buf).m_size];
          }
          if (uVar14 == uVar8) {
            this->m_curToken = TOKEN_STRING;
LAB_00119ebc:
            this->m_curTokenLen = this->m_curTokenLen + 1;
            return;
          }
          goto LAB_00119fc4;
        }
        break;
      case STATE_COMMENT:
        if (iVar11 < 4) {
          if (uVar14 != 0x2d) goto LAB_00119f18;
        }
        else {
          if ((iVar11 < 6) || (iVar13 <= iVar11 + -2)) {
            bVar15 = false;
          }
          else {
            bVar15 = puVar3[(iVar11 + -2 + iVar7) % iVar2] == '-';
          }
          if (iVar13 < iVar11 || iVar11 == 4) {
            bVar16 = false;
          }
          else {
            bVar16 = puVar3[(iVar11 + iVar7 + -1) % iVar2] == '-';
          }
          if ((bool)(bVar15 & bVar16)) {
            if (uVar14 == 0x3e) {
              this->m_curToken = TOKEN_COMMENT;
              goto LAB_00119ebc;
            }
            goto LAB_0011a045;
          }
        }
        break;
      case STATE_ENTITY:
        if (0 < iVar11) {
          if (uVar14 == 0x3b) {
            this->m_curToken = TOKEN_ENTITY;
            this->m_curTokenLen = iVar11 + 1;
            return;
          }
          if ((9 < uVar14 - 0x30) && (0x19 < (uVar14 & 0xffffffdf) - 0x41)) goto LAB_00119f6e;
        }
        break;
      default:
        uVar8 = 0xffffffff;
        if (iVar11 + -1 < iVar13) {
          uVar8 = (uint)puVar3[(iVar11 + -1 + iVar7) % iVar2];
        }
        if (uVar8 == 0x3c) {
          SVar10 = STATE_COMMENT;
          if (uVar14 == 0x21) goto switchD_00119c9b_caseD_3c;
          if (uVar14 == 0x3f) {
            uVar5 = 0x20000000a;
          }
          else if (uVar14 == 0x2f) {
            uVar5 = 0x200000008;
          }
          else {
            uVar5 = 0x100000006;
          }
          goto LAB_00119b10;
        }
        if (uVar8 == 0x2f) {
          if (uVar14 != 0x3e) goto LAB_0011a01a;
          uVar5 = 0x200000009;
        }
        else {
          if (uVar8 != 0x3f) goto LAB_00119f43;
          if (uVar14 != 0x3e) goto LAB_00119fef;
          uVar5 = 0x20000000b;
        }
        goto LAB_00119b10;
      }
    }
LAB_00119db6:
    iVar11 = iVar11 + 1;
    this->m_curTokenLen = iVar11;
    uVar14 = 0xffffffff;
    if (iVar11 < iVar13) {
      uVar14 = (uint)puVar3[((int)uVar6 + iVar11) % iVar2];
    }
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pTVar12 = (Tokenizer *)&local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)pTVar12,"Unexpected end of string","");
  error(pTVar12,&local_50);
LAB_00119f18:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pTVar12 = (Tokenizer *)&local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)pTVar12,"Invalid comment start","");
  error(pTVar12,&local_50);
LAB_00119f43:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pTVar12 = (Tokenizer *)&local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)pTVar12,"Could not parse special token","");
  error(pTVar12,&local_50);
LAB_00119f6e:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pTVar12 = (Tokenizer *)&local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)pTVar12,"Invalid entity","");
  error(pTVar12,&local_50);
LAB_00119f99:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pTVar12 = (Tokenizer *)&local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)pTVar12,"Unexpected character","");
  error(pTVar12,&local_50);
LAB_00119fc4:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pTVar12 = (Tokenizer *)&local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)pTVar12,"Mismatched quote","");
  error(pTVar12,&local_50);
LAB_00119fef:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pTVar12 = (Tokenizer *)&local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)pTVar12,"Invalid processing instruction end","");
  error(pTVar12,&local_50);
LAB_0011a01a:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pTVar12 = (Tokenizer *)&local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)pTVar12,"Invalid empty element end","");
  error(pTVar12,&local_50);
LAB_0011a045:
  pTVar12 = (Tokenizer *)&local_50;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pTVar12,"Invalid comment end","");
  error(pTVar12,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Tokenizer::advance (void)
{
	if (m_curToken != TOKEN_INCOMPLETE)
	{
		// Parser should not try to advance beyond end of string.
		DE_ASSERT(m_curToken != TOKEN_END_OF_STRING);

		// If current token is tag end, change state to data.
		if (m_curToken == TOKEN_TAG_END						||
			m_curToken == TOKEN_EMPTY_ELEMENT_END			||
			m_curToken == TOKEN_PROCESSING_INSTRUCTION_END	||
			m_curToken == TOKEN_COMMENT						||
			m_curToken == TOKEN_ENTITY)
			m_state = STATE_DATA;

		// Advance buffer by length of last token.
		m_buf.popBack(m_curTokenLen);

		// Reset state.
		m_curToken		= TOKEN_INCOMPLETE;
		m_curTokenLen	= 0;

		// If we hit end of string here, report it as end of string.
		if (getChar(0) == END_OF_STRING)
		{
			m_curToken		= TOKEN_END_OF_STRING;
			m_curTokenLen	= 1;
			return;
		}
	}

	int curChar = getChar(m_curTokenLen);

	for (;;)
	{
		if (m_state == STATE_DATA)
		{
			// Advance until we hit end of buffer or tag start and treat that as data token.
			if (curChar == END_OF_STRING || curChar == (int)END_OF_BUFFER || curChar == '<' || curChar == '&')
			{
				if (curChar == '<')
					m_state = STATE_TAG;
				else if (curChar == '&')
					m_state = STATE_ENTITY;

				if (m_curTokenLen > 0)
				{
					// Report data token.
					m_curToken = TOKEN_DATA;
					return;
				}
				else if (curChar == END_OF_STRING || curChar == (int)END_OF_BUFFER)
				{
					// Just return incomplete token, no data parsed.
					return;
				}
				else
				{
					DE_ASSERT(m_state == STATE_TAG || m_state == STATE_ENTITY);
					continue;
				}
			}
		}
		else
		{
			// Eat all whitespace if present.
			if (m_curTokenLen == 0)
			{
				while (isWhitespaceChar(curChar))
				{
					m_buf.popBack();
					curChar = getChar(0);
				}
			}

			// Handle end of string / buffer.
			if (curChar == END_OF_STRING)
				error("Unexpected end of string");
			else if (curChar == (int)END_OF_BUFFER)
			{
				DE_ASSERT(m_curToken == TOKEN_INCOMPLETE);
				return;
			}

			if (m_curTokenLen == 0)
			{
				// Expect start of identifier, value or special tag token.
				if (curChar == '\'' || curChar == '"')
					m_state = STATE_VALUE;
				else if (isIdentifierStartChar(curChar))
					m_state = STATE_IDENTIFIER;
				else if (curChar == '<' || curChar == '?' || curChar == '/')
					m_state = STATE_TAG;
				else if (curChar == '&')
					DE_ASSERT(m_state == STATE_ENTITY);
				else if (curChar == '=')
				{
					m_curToken		= TOKEN_EQUAL;
					m_curTokenLen	= 1;
					return;
				}
				else if (curChar == '>')
				{
					m_curToken		= TOKEN_TAG_END;
					m_curTokenLen	= 1;
					return;
				}
				else
					error("Unexpected character");
			}
			else if (m_state == STATE_IDENTIFIER)
			{
				if (!isIdentifierChar(curChar))
				{
					m_curToken = TOKEN_IDENTIFIER;
					return;
				}
			}
			else if (m_state == STATE_VALUE)
			{
				// \todo [2012-06-07 pyry] Escapes.
				if (curChar == '\'' || curChar == '"')
				{
					// \todo [2012-10-17 pyry] Should we actually do the check against getChar(0)?
					if (curChar != getChar(0))
						error("Mismatched quote");
					m_curToken		 = TOKEN_STRING;
					m_curTokenLen	+= 1;
					return;
				}
			}
			else if (m_state == STATE_COMMENT)
			{
				DE_ASSERT(m_curTokenLen >= 2); // 2 characters have been parsed if we are in comment state.

				if (m_curTokenLen <= 3)
				{
					if (curChar != '-')
						error("Invalid comment start");
				}
				else
				{
					int prev2 = m_curTokenLen > 5 ? getChar(m_curTokenLen-2) : 0;
					int prev1 = m_curTokenLen > 4 ? getChar(m_curTokenLen-1) : 0;

					if (prev2 == '-' && prev1 == '-')
					{
						if (curChar != '>')
							error("Invalid comment end");
						m_curToken		 = TOKEN_COMMENT;
						m_curTokenLen	+= 1;
						return;
					}
				}
			}
			else if (m_state == STATE_ENTITY)
			{
				if (m_curTokenLen >= 1)
				{
					if (curChar == ';')
					{
						m_curToken		 = TOKEN_ENTITY;
						m_curTokenLen	+= 1;
						return;
					}
					else if (!de::inRange<int>(curChar, '0', '9')	&&
							 !de::inRange<int>(curChar, 'a', 'z')	&&
							 !de::inRange<int>(curChar, 'A', 'Z'))
						error("Invalid entity");
				}
			}
			else
			{
				// Special tokens are at most 2 characters.
				DE_ASSERT(m_state == STATE_TAG && m_curTokenLen == 1);

				int prevChar = getChar(m_curTokenLen-1);

				if (prevChar == '<')
				{
					// Tag start.
					if (curChar == '/')
					{
						m_curToken		= TOKEN_END_TAG_START;
						m_curTokenLen	= 2;
						return;
					}
					else if (curChar == '?')
					{
						m_curToken		= TOKEN_PROCESSING_INSTRUCTION_START;
						m_curTokenLen	= 2;
						return;
					}
					else if (curChar == '!')
					{
						m_state = STATE_COMMENT;
					}
					else
					{
						m_curToken		= TOKEN_TAG_START;
						m_curTokenLen	= 1;
						return;
					}
				}
				else if (prevChar == '?')
				{
					if (curChar != '>')
						error("Invalid processing instruction end");
					m_curToken		= TOKEN_PROCESSING_INSTRUCTION_END;
					m_curTokenLen	= 2;
					return;
				}
				else if (prevChar == '/')
				{
					if (curChar != '>')
						error("Invalid empty element end");
					m_curToken		= TOKEN_EMPTY_ELEMENT_END;
					m_curTokenLen	= 2;
					return;
				}
				else
					error("Could not parse special token");
			}
		}

		m_curTokenLen	+= 1;
		curChar			 = getChar(m_curTokenLen);
	}
}